

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_move_to_first(nk_text_edit *state)

{
  nk_text_edit *state_local;
  
  if (state->select_start != state->select_end) {
    nk_textedit_sortselection(state);
    state->cursor = state->select_start;
    state->select_end = state->select_start;
    state->has_preferred_x = '\0';
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_move_to_first(struct nk_text_edit *state)
{
    /* move cursor to first character of selection */
    if (NK_TEXT_HAS_SELECTION(state)) {
        nk_textedit_sortselection(state);
        state->cursor = state->select_start;
        state->select_end = state->select_start;
        state->has_preferred_x = 0;
    }
}